

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O3

void accumulate_weighted_avg(vw *all,parameters *weights)

{
  sparse_parameters *this;
  uint32_t uVar1;
  _func_void_weight_ptr_void_ptr *p_Var2;
  weight *pwVar3;
  ulong uVar4;
  vw *all_00;
  float *buffer;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var5;
  uint64_t n;
  uint64_t i;
  uint64_t uVar6;
  uint64_t index;
  ulong local_58;
  ulong local_50;
  vw *local_48;
  ulong local_40;
  float *local_38;
  
  if (all->adaptive == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&(all->trace_message).super_ostream,
               "Weighted averaging is implemented only for adaptive gradient, use accumulate_avg instead\n"
               ,0x59);
    return;
  }
  local_50 = (ulong)all->num_bits;
  n = 1L << ((byte)all->num_bits & 0x3f);
  local_48 = all;
  buffer = (float *)operator_new__(n * 4);
  if (weights->sparse == false) {
    uVar1 = (weights->dense_weights)._stride_shift;
    pwVar3 = (weights->dense_weights)._begin;
    uVar4 = (weights->dense_weights)._weight_mask;
    uVar6 = 0;
    do {
      buffer[uVar6] = pwVar3[(uVar6 << ((byte)uVar1 & 0x3f) & uVar4) + 1];
      uVar6 = uVar6 + 1;
    } while (n != uVar6);
  }
  else {
    this = &weights->sparse_weights;
    uVar6 = 0;
    do {
      local_58 = uVar6 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                 (weights->sparse_weights)._weight_mask;
      _Var5._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)this,&local_58);
      if (_Var5._M_cur == (__node_type *)0x0) {
        local_38 = calloc_or_throw<float>
                             (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
        local_40 = local_58;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,float*>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)this,&local_40);
        _Var5._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)this,&local_58);
        p_Var2 = (weights->sparse_weights).fun;
        if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
          (*p_Var2)(*(weight **)((long)_Var5._M_cur + 0x10),(weights->sparse_weights).default_data);
        }
      }
      buffer[uVar6] =
           *(float *)(*(long *)((long)&((_Var5._M_cur)->
                                       super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                       ).
                                       super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                       ._M_storage._M_storage + 8) + 4);
      uVar6 = uVar6 + 1;
    } while (n != uVar6);
  }
  all_00 = local_48;
  all_reduce<float,_&add_float>(local_48,buffer,n);
  if (weights->sparse == true) {
    do_weighting<sparse_parameters>(all_00,n,buffer,&weights->sparse_weights);
  }
  else {
    do_weighting<dense_parameters>(all_00,n,buffer,&weights->dense_weights);
  }
  if (weights->sparse == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"sparse parameters not supported with parallel computation!",
               0x3a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
  }
  else {
    all_reduce<float,_&add_float>
              (all_00,(weights->dense_weights)._begin,
               (long)(1 << ((byte)(weights->dense_weights)._stride_shift & 0x1f)) <<
               ((byte)local_50 & 0x3f));
  }
  operator_delete__(buffer);
  return;
}

Assistant:

void accumulate_weighted_avg(vw& all, parameters& weights)
{
  if (!all.adaptive)
  {
    all.trace_message << "Weighted averaging is implemented only for adaptive gradient, use accumulate_avg instead\n";
    return;
  }
  uint32_t length = 1 << all.num_bits;  // This is the number of parameters
  float* local_weights = new float[length];

  if (weights.sparse)
    for (uint64_t i = 0; i < length; i++)
      local_weights[i] = (&(weights.sparse_weights[i << weights.sparse_weights.stride_shift()]))[1];
  else
    for (uint64_t i = 0; i < length; i++)
      local_weights[i] = (&(weights.dense_weights[i << weights.dense_weights.stride_shift()]))[1];

  // First compute weights for averaging
  all_reduce<float, add_float>(all, local_weights, length);

  if (weights.sparse)
    do_weighting(all, length, local_weights, weights.sparse_weights);
  else
    do_weighting(all, length, local_weights, weights.dense_weights);

  if (weights.sparse)
    cout << "sparse parameters not supported with parallel computation!" << endl;
  else
    all_reduce<float, add_float>(all, weights.dense_weights.first(), ((size_t)length) * (1 << weights.stride_shift()));
  delete[] local_weights;
}